

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  U32 UVar1;
  U32 UVar2;
  U32 UVar3;
  U32 local_2c;
  U32 local_24;
  U32 llCode;
  int optLevel_local;
  optState_t *optPtr_local;
  U32 litLength_local;
  
  if (optPtr->priceType == zop_predef) {
    if (optLevel == 0) {
      local_24 = ZSTD_bitWeight(litLength);
    }
    else {
      local_24 = ZSTD_fracWeight(litLength);
    }
    optPtr_local._4_4_ = local_24;
  }
  else {
    UVar3 = ZSTD_LLcode(litLength);
    UVar1 = LL_bits[UVar3];
    UVar2 = optPtr->litLengthSumBasePrice;
    if (optLevel == 0) {
      local_2c = ZSTD_bitWeight(optPtr->litLengthFreq[UVar3]);
    }
    else {
      local_2c = ZSTD_fracWeight(optPtr->litLengthFreq[UVar3]);
    }
    optPtr_local._4_4_ = (UVar1 * 0x100 + UVar2) - local_2c;
  }
  return optPtr_local._4_4_;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    if (optPtr->priceType == zop_predef) return WEIGHT(litLength, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}